

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O2

bool __thiscall
wasm::anon_unknown_23::EscapeAnalyzer::escapes(EscapeAnalyzer *this,Expression *allocation)

{
  __node_base_ptr *__return_storage_ptr__;
  ulong uVar1;
  BranchTargets *this_00;
  _Hash_node_base curr;
  pair<wasm::Expression_*,_wasm::Expression_*> pVar2;
  __node_base _Var3;
  bool bVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  Expression **ppEVar7;
  Expression *pEVar8;
  Resume *pRVar9;
  Break *pBVar10;
  TryTable *pTVar11;
  Try *pTVar12;
  Switch *pSVar13;
  BrOn *pBVar14;
  ResumeThrow *pRVar15;
  Name *pNVar16;
  _Rb_tree_node_base *p_Var17;
  mapped_type *pmVar18;
  SetInfluences *pSVar19;
  __node_base _Var20;
  size_type sVar21;
  mapped_type mVar22;
  uint uVar23;
  __node_base *p_Var24;
  __node_base *p_Var25;
  _Base_ptr this_01;
  bool bVar26;
  pair<wasm::Expression_*,_wasm::Expression_*> item;
  pair<wasm::Expression_*,_wasm::Expression_*> item_00;
  pair<wasm::Expression_*,_wasm::Expression_*> item_01;
  pair<wasm::Expression_*,_wasm::Expression_*> item_02;
  pair<wasm::Expression_*,_wasm::Expression_*> pVar27;
  Name name;
  undefined1 local_1a8 [8];
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> flows;
  Iterator __end3;
  Expression *local_b8;
  Expression *parent;
  unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
  *__range2;
  LocalSet *set;
  __node_base local_98;
  _Rb_tree_node_base *p_Stack_90;
  _Rb_tree_node_base *local_88;
  _Base_ptr local_80;
  undefined1 auStack_78 [16];
  __node_base local_68;
  Expression *child;
  LocalGet *get;
  size_t local_50;
  _Rb_tree_const_iterator<wasm::LocalSet_*> local_48;
  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
  *local_40;
  mapped_type local_31;
  
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::
  UniqueNonrepeatingDeferredQueue
            ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *)
             local_1a8);
  pEVar5 = Parents::getParent(this->parents,allocation);
  item.second = pEVar5;
  item.first = allocation;
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
            ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *)
             local_1a8,item);
  parent = (Expression *)&this->sets;
  local_40 = &this->reachedInteractions;
  while (bVar4 = UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::empty
                           ((UniqueDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                             *)local_1a8), !bVar4) {
    pVar27 = UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::
             pop((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                  *)local_1a8);
    pEVar8 = pVar27.second;
    pEVar5 = pVar27.first;
    if (pEVar8 == (Expression *)0x0) goto switchD_00a1ffe3_caseD_2;
    mVar22 = FullyConsumes;
    local_b8 = pEVar8;
    pVar2 = pVar27;
    local_68._M_nxt = (_Hash_node_base *)pEVar5;
    switch(pEVar8->_id) {
    case BlockId:
    case LoopId:
    case BreakId:
    case SwitchId:
    case LocalGetId:
    case LocalSetId:
switchD_00a1ffe3_caseD_1:
      local_b8 = pVar2.second;
      local_68._M_nxt = (_Hash_node_base *)pVar2.first;
      pVar27.second = pEVar8;
      pVar27.first = (Expression *)local_68._M_nxt;
      uVar1 = (pEVar8->type).id;
      if ((uVar1 & 1) == 0 && 6 < uVar1) {
        pEVar6 = Properties::getImmediateFallthrough
                           (pEVar8,this->passOptions,this->wasm,AllowTeeBrIf);
        if (pEVar6 != pEVar5) {
          this_00 = this->branchTargets;
          name = BranchUtils::getDefinedName(pEVar8);
          BranchUtils::BranchTargets::getBranches
                    ((unordered_set<wasm::Expression_*,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>
                      *)&__range2,this_00,name);
          if ((((p_Stack_90 != (_Rb_tree_node_base *)0x1) ||
               (pEVar6 = BranchUtils::getSentValue(*(Expression **)(local_98._M_nxt + 1)),
               pEVar6 != pEVar5)) || (pEVar8->_id != BlockId)) ||
             (ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                    *)(pEVar8 + 2)), ((*ppEVar7)->type).id != 1)) {
            std::
            _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&__range2);
            pVar27.second = local_b8;
            pVar27.first = (Expression *)local_68._M_nxt;
            goto switchD_00a1ffe3_caseD_2;
          }
          std::
          _Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<wasm::Expression_*,_wasm::Expression_*,_std::allocator<wasm::Expression_*>,_std::__detail::_Identity,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&__range2);
        }
        pEVar5 = local_b8;
        pEVar8 = Parents::getParent(this->parents,local_b8);
        item_00.second = pEVar8;
        item_00.first = pEVar5;
        UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
                  ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                    *)local_1a8,item_00);
        pVar27.second = pEVar5;
        pVar27.first = (Expression *)local_68._M_nxt;
        mVar22 = Flows;
      }
      break;
    case IfId:
    case CallId:
    case CallIndirectId:
    case GlobalGetId:
    case GlobalSetId:
    case LoadId:
    case StoreId:
    case ConstId:
    case UnaryId:
    case BinaryId:
    case SelectId:
    case ReturnId:
    case MemorySizeId:
    case MemoryGrowId:
    case NopId:
    case UnreachableId:
    case AtomicRMWId:
    case AtomicCmpxchgId:
    case AtomicWaitId:
    case AtomicNotifyId:
    case AtomicFenceId:
    case SIMDExtractId:
    case SIMDReplaceId:
    case SIMDShuffleId:
    case SIMDTernaryId:
    case SIMDShiftId:
    case SIMDLoadId:
    case SIMDLoadStoreLaneId:
    case MemoryInitId:
    case DataDropId:
    case MemoryCopyId:
    case MemoryFillId:
    case PopId:
    case RefNullId:
    case RefFuncId:
    case TableGetId:
    case TableSetId:
    case TableSizeId:
    case TableGrowId:
    case TableFillId:
    case TableCopyId:
    case TableInitId:
    case TryId:
    case TryTableId:
    case ThrowId:
    case RethrowId:
    case ThrowRefId:
    case TupleMakeId:
    case TupleExtractId:
    case RefI31Id:
    case I31GetId:
    case CallRefId:
    case BrOnId:
    case StructNewId:
    case ArrayNewId:
    case ArrayNewDataId:
    case ArrayNewElemId:
    case ArrayNewFixedId:
    case ArrayLenId:
    case ArrayCopyId:
    case ArrayFillId:
    case ArrayInitDataId:
    case ArrayInitElemId:
    case StringNewId:
    case StringConstId:
    case StringMeasureId:
    case StringEncodeId:
    case StringConcatId:
    case StringEqId:
    case StringWTF16GetId:
    case StringSliceWTFId:
    case ContNewId:
    case ContBindId:
    case SuspendId:
    case ResumeId:
    case ResumeThrowId:
    case StackSwitchId:
      goto switchD_00a1ffe3_caseD_2;
    case DropId:
    case RefIsNullId:
    case RefEqId:
    case RefTestId:
    case StructGetId:
      break;
    case RefCastId:
      bVar4 = wasm::Type::isSubType((Type)(allocation->type).id,(Type)(pEVar8->type).id);
      pVar2.second = local_b8;
      pVar2.first = (Expression *)local_68._M_nxt;
      pVar27.second = pEVar8;
      pVar27.first = (Expression *)local_68._M_nxt;
      if (bVar4) goto switchD_00a1ffe3_caseD_1;
      break;
    case StructSetId:
    case StructRMWId:
      pEVar8 = (Expression *)pEVar8[1].type.id;
joined_r0x00a200e9:
      if (pEVar8 != pEVar5) goto switchD_00a1ffe3_caseD_2;
      break;
    case StructCmpxchgId:
      if ((Expression *)pEVar8[1].type.id != pEVar5) {
        pEVar8 = *(Expression **)(pEVar8 + 2);
        goto joined_r0x00a200e9;
      }
      break;
    case ArrayGetId:
      if (*(char *)pEVar8[1].type.id != '\x0e') goto switchD_00a1ffe3_caseD_2;
      break;
    case ArraySetId:
      if (*(char *)pEVar8[1].type.id == '\x0e') {
        pEVar8 = *(Expression **)(pEVar8 + 1);
        goto joined_r0x00a200e9;
      }
      goto switchD_00a1ffe3_caseD_2;
    case RefAsId:
      if (*(int *)(pEVar8 + 1) == 0) goto switchD_00a1ffe3_caseD_1;
switchD_00a1ffe3_caseD_2:
      bVar4 = true;
      goto LAB_00a20970;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    local_31 = mVar22;
    this_01 = (_Base_ptr)pVar27.second;
    local_68._M_nxt = (_Hash_node_base *)pVar27.first;
    __range2 = (unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                *)(_Base_ptr)0x0;
    if ((Id)this_01->_M_color == LocalSetId) {
      __range2 = (unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                  *)this_01;
    }
    if ((_Base_ptr)__range2 != (_Base_ptr)0x0) {
      std::__detail::
      _Insert_base<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)parent,(value_type *)&__range2);
      pSVar19 = LazyLocalGraph::getSetInfluences(this->localGraph,(LocalSet *)__range2);
      p_Var24 = &(pSVar19->_M_h)._M_before_begin;
      while (p_Var24 = p_Var24->_M_nxt, p_Var24 != (__node_base *)0x0) {
        curr._M_nxt = p_Var24[1]._M_nxt;
        pEVar5 = Parents::getParent(this->parents,(Expression *)curr._M_nxt);
        item_01.second = pEVar5;
        item_01.first = (Expression *)curr._M_nxt;
        UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
                  ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                    *)local_1a8,item_01);
      }
    }
    set = (LocalSet *)((ulong)set & 0xffffffff00000000);
    local_98._M_nxt = (_Hash_node_base *)0x0;
    p_Stack_90 = (_Rb_tree_node_base *)&set;
    local_80 = (_Base_ptr)0x0;
    __end3.flexibleIterator._M_node = (_Base_ptr)local_68._M_nxt;
    flows.processed._M_h._M_single_bucket = (__node_base_ptr)&__end3.flexibleIterator;
    __end3.parent =
         (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          *)&__range2;
    child = (Expression *)(auStack_78 + 8);
    get = (LocalGet *)&flows.processed._M_h._M_single_bucket;
    p_Var17 = p_Stack_90;
    local_88 = p_Stack_90;
    auStack_78._8_8_ = this_01;
    mVar22 = local_31;
    _Var3._M_nxt = local_68._M_nxt;
    switch((Id)this_01->_M_color) {
    case InvalidId:
    case NumExpressionIds:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                         ,0x103);
    case BlockId:
      Expression::cast<wasm::Block>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case IfId:
      Expression::cast<wasm::If>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case LoopId:
      Expression::cast<wasm::Loop>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case BreakId:
      pBVar10 = Expression::cast<wasm::Break>((Expression *)this_01);
      goto LAB_00a20510;
    case SwitchId:
      pSVar13 = Expression::cast<wasm::Switch>((Expression *)this_01);
      BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                ((anon_class_16_2_3f140c08 *)&child,&pSVar13->default_);
      for (uVar23 = 0; p_Var17 = p_Stack_90, mVar22 = local_31, _Var3._M_nxt = local_68._M_nxt,
          (ulong)uVar23 <
          (pSVar13->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
          ; uVar23 = uVar23 + 1) {
        pNVar16 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pSVar13->targets).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)uVar23);
        BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                  ((anon_class_16_2_3f140c08 *)&child,pNVar16);
      }
      break;
    case CallId:
      Expression::cast<wasm::Call>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case CallIndirectId:
      Expression::cast<wasm::CallIndirect>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case LocalGetId:
      Expression::cast<wasm::LocalGet>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case LocalSetId:
      Expression::cast<wasm::LocalSet>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case GlobalGetId:
      Expression::cast<wasm::GlobalGet>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case GlobalSetId:
      Expression::cast<wasm::GlobalSet>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case LoadId:
      Expression::cast<wasm::Load>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StoreId:
      Expression::cast<wasm::Store>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ConstId:
      Expression::cast<wasm::Const>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case UnaryId:
      Expression::cast<wasm::Unary>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case BinaryId:
      Expression::cast<wasm::Binary>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case SelectId:
      Expression::cast<wasm::Select>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case DropId:
      Expression::cast<wasm::Drop>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ReturnId:
      Expression::cast<wasm::Return>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case MemorySizeId:
      Expression::cast<wasm::MemorySize>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case MemoryGrowId:
      Expression::cast<wasm::MemoryGrow>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case NopId:
      Expression::cast<wasm::Nop>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case UnreachableId:
      Expression::cast<wasm::Unreachable>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case AtomicRMWId:
      Expression::cast<wasm::AtomicRMW>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case AtomicCmpxchgId:
      Expression::cast<wasm::AtomicCmpxchg>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case AtomicWaitId:
      Expression::cast<wasm::AtomicWait>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case AtomicNotifyId:
      Expression::cast<wasm::AtomicNotify>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case AtomicFenceId:
      Expression::cast<wasm::AtomicFence>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case SIMDExtractId:
      Expression::cast<wasm::SIMDExtract>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case SIMDReplaceId:
      Expression::cast<wasm::SIMDReplace>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case SIMDShuffleId:
      Expression::cast<wasm::SIMDShuffle>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case SIMDTernaryId:
      Expression::cast<wasm::SIMDTernary>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case SIMDShiftId:
      Expression::cast<wasm::SIMDShift>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case SIMDLoadId:
      Expression::cast<wasm::SIMDLoad>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case SIMDLoadStoreLaneId:
      Expression::cast<wasm::SIMDLoadStoreLane>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case MemoryInitId:
      Expression::cast<wasm::MemoryInit>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case DataDropId:
      Expression::cast<wasm::DataDrop>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case MemoryCopyId:
      Expression::cast<wasm::MemoryCopy>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case MemoryFillId:
      Expression::cast<wasm::MemoryFill>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case PopId:
      Expression::cast<wasm::Pop>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case RefNullId:
      Expression::cast<wasm::RefNull>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case RefIsNullId:
      Expression::cast<wasm::RefIsNull>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case RefFuncId:
      Expression::cast<wasm::RefFunc>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case RefEqId:
      Expression::cast<wasm::RefEq>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case TableGetId:
      Expression::cast<wasm::TableGet>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case TableSetId:
      Expression::cast<wasm::TableSet>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case TableSizeId:
      Expression::cast<wasm::TableSize>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case TableGrowId:
      Expression::cast<wasm::TableGrow>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case TableFillId:
      Expression::cast<wasm::TableFill>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case TableCopyId:
      Expression::cast<wasm::TableCopy>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case TableInitId:
      Expression::cast<wasm::TableInit>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case TryId:
      pTVar12 = Expression::cast<wasm::Try>((Expression *)this_01);
      pNVar16 = &pTVar12->delegateTarget;
      goto LAB_00a20626;
    case TryTableId:
      pTVar11 = Expression::cast<wasm::TryTable>((Expression *)this_01);
      for (uVar23 = 0; p_Var17 = p_Stack_90, mVar22 = local_31, _Var3._M_nxt = local_68._M_nxt,
          (ulong)uVar23 <
          (pTVar11->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
          usedElements; uVar23 = uVar23 + 1) {
        pNVar16 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pTVar11->catchDests).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)uVar23);
        BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                  ((anon_class_16_2_3f140c08 *)&child,pNVar16);
      }
      break;
    case ThrowId:
      Expression::cast<wasm::Throw>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case RethrowId:
      pBVar10 = (Break *)Expression::cast<wasm::Rethrow>((Expression *)this_01);
LAB_00a20510:
      pNVar16 = &pBVar10->name;
      goto LAB_00a20626;
    case ThrowRefId:
      Expression::cast<wasm::ThrowRef>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case TupleMakeId:
      Expression::cast<wasm::TupleMake>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case TupleExtractId:
      Expression::cast<wasm::TupleExtract>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case RefI31Id:
      Expression::cast<wasm::RefI31>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case I31GetId:
      Expression::cast<wasm::I31Get>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case CallRefId:
      Expression::cast<wasm::CallRef>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case RefTestId:
      Expression::cast<wasm::RefTest>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case RefCastId:
      Expression::cast<wasm::RefCast>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case BrOnId:
      pBVar14 = Expression::cast<wasm::BrOn>((Expression *)this_01);
      pNVar16 = &pBVar14->name;
LAB_00a20626:
      BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                ((anon_class_16_2_3f140c08 *)&child,pNVar16);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StructNewId:
      Expression::cast<wasm::StructNew>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StructGetId:
      Expression::cast<wasm::StructGet>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StructSetId:
      Expression::cast<wasm::StructSet>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StructRMWId:
      Expression::cast<wasm::StructRMW>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StructCmpxchgId:
      Expression::cast<wasm::StructCmpxchg>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ArrayNewId:
      Expression::cast<wasm::ArrayNew>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ArrayNewDataId:
      Expression::cast<wasm::ArrayNewData>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ArrayNewElemId:
      Expression::cast<wasm::ArrayNewElem>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ArrayNewFixedId:
      Expression::cast<wasm::ArrayNewFixed>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ArrayGetId:
      Expression::cast<wasm::ArrayGet>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ArraySetId:
      Expression::cast<wasm::ArraySet>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ArrayLenId:
      Expression::cast<wasm::ArrayLen>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ArrayCopyId:
      Expression::cast<wasm::ArrayCopy>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ArrayFillId:
      Expression::cast<wasm::ArrayFill>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ArrayInitDataId:
      Expression::cast<wasm::ArrayInitData>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ArrayInitElemId:
      Expression::cast<wasm::ArrayInitElem>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case RefAsId:
      Expression::cast<wasm::RefAs>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StringNewId:
      Expression::cast<wasm::StringNew>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StringConstId:
      Expression::cast<wasm::StringConst>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StringMeasureId:
      Expression::cast<wasm::StringMeasure>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StringEncodeId:
      Expression::cast<wasm::StringEncode>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StringConcatId:
      Expression::cast<wasm::StringConcat>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StringEqId:
      Expression::cast<wasm::StringEq>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StringWTF16GetId:
      Expression::cast<wasm::StringWTF16Get>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case StringSliceWTFId:
      Expression::cast<wasm::StringSliceWTF>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ContNewId:
      Expression::cast<wasm::ContNew>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ContBindId:
      Expression::cast<wasm::ContBind>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case SuspendId:
      Expression::cast<wasm::Suspend>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
      break;
    case ResumeId:
      pRVar9 = Expression::cast<wasm::Resume>((Expression *)this_01);
      for (uVar23 = 0; p_Var17 = p_Stack_90, mVar22 = local_31, _Var3._M_nxt = local_68._M_nxt,
          (ulong)uVar23 <
          (pRVar9->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
          usedElements; uVar23 = uVar23 + 1) {
        pNVar16 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pRVar9->handlerBlocks).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)uVar23);
        BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                  ((anon_class_16_2_3f140c08 *)&child,pNVar16);
      }
      break;
    case ResumeThrowId:
      pRVar15 = Expression::cast<wasm::ResumeThrow>((Expression *)this_01);
      for (uVar23 = 0; p_Var17 = p_Stack_90, mVar22 = local_31, _Var3._M_nxt = local_68._M_nxt,
          (ulong)uVar23 <
          (pRVar15->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
          usedElements; uVar23 = uVar23 + 1) {
        pNVar16 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            (&(pRVar15->handlerBlocks).
                              super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                             (ulong)uVar23);
        BranchUtils::anon_func::anon_class_16_2_3f140c08::operator()
                  ((anon_class_16_2_3f140c08 *)&child,pNVar16);
      }
      break;
    case StackSwitchId:
      Expression::cast<wasm::StackSwitch>((Expression *)this_01);
      p_Var17 = p_Stack_90;
      mVar22 = local_31;
      _Var3._M_nxt = local_68._M_nxt;
    }
    for (; p_Var17 != (_Rb_tree_node_base *)&set;
        p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
      pEVar5 = BranchUtils::BranchTargets::getTarget
                         (this->branchTargets,(Name)*(string_view *)(p_Var17 + 1));
      item_02.second = pEVar5;
      item_02.first = (Expression *)_Var3._M_nxt;
      UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::push
                ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>
                  *)local_1a8,item_02);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&__range2);
    pmVar18 = std::
              unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
              ::operator[](local_40,(key_type *)&local_68);
    *pmVar18 = Flows;
    pmVar18 = std::
              unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
              ::operator[](local_40,&local_b8);
    *pmVar18 = mVar22;
  }
  __range2 = (unordered_set<wasm::LocalSet_*,_std::hash<wasm::LocalSet_*>,_std::equal_to<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
              *)auStack_78;
  set = (LocalSet *)0x1;
  local_98._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_90 = (_Rb_tree_node_base *)0x0;
  local_88 = (_Rb_tree_node_base *)CONCAT44(local_88._4_4_,0x3f800000);
  local_80 = (_Base_ptr)0x0;
  auStack_78._0_8_ = (_Base_ptr)0x0;
  p_Var25 = &(this->sets)._M_h._M_before_begin;
  while (p_Var25 = p_Var25->_M_nxt, p_Var25 != (__node_base *)0x0) {
    pSVar19 = LazyLocalGraph::getSetInfluences(this->localGraph,(LocalSet *)p_Var25[1]._M_nxt);
    p_Var24 = &(pSVar19->_M_h)._M_before_begin;
    while (p_Var24 = p_Var24->_M_nxt, p_Var24 != (__node_base *)0x0) {
      child = *(Expression **)(p_Var24 + 1);
      std::__detail::
      _Insert_base<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert((_Insert_base<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&__range2,(value_type *)&child);
    }
  }
  __return_storage_ptr__ = &flows.processed._M_h._M_single_bucket;
  _Var20._M_nxt = local_98._M_nxt;
  while (bVar4 = (unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                  *)_Var20._M_nxt !=
                 (unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                  *)0x0, bVar4) {
    local_40 = (unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                *)_Var20._M_nxt;
    child = (Expression *)
            LazyLocalGraph::getSets
                      (this->localGraph,
                       (LocalGet *)
                       (((unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::ParentChildInteraction,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::ParentChildInteraction>_>_>
                          *)_Var20._M_nxt)->_M_h)._M_bucket_count);
    local_48._M_node = (_Base_ptr)0x0;
    bVar26 = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                *)child)->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
    get = (LocalGet *)CONCAT71(get._1_7_,bVar26);
    if (bVar26) {
      local_50 = 0;
    }
    else {
      local_48._M_node =
           (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
              *)child)->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ::end((Iterator *)__return_storage_ptr__,
          (SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
           *)child);
    while (bVar26 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                    ::
                    IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                    ::operator!=((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                  *)&child,(Iterator *)__return_storage_ptr__), bVar26) {
      auStack_78._8_8_ = local_48._M_node + 1;
      if ((char)get != '\0') {
        auStack_78._8_8_ = (_Base_ptr)(&child->type + local_50);
      }
      auStack_78._8_8_ = *(undefined8 *)auStack_78._8_8_;
      sVar21 = std::
               _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)parent,(key_type *)(auStack_78 + 8));
      if (sVar21 == 0) goto LAB_00a20953;
      SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
      ::
      IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
      ::operator++((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                    *)&child);
    }
    _Var20._M_nxt = (_Hash_node_base *)(local_40->_M_h)._M_buckets;
  }
LAB_00a20953:
  std::
  _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&__range2);
  pVar27.second = local_b8;
  pVar27.first = (Expression *)local_68._M_nxt;
LAB_00a20970:
  local_b8 = pVar27.second;
  local_68._M_nxt = (_Hash_node_base *)pVar27.first;
  UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_>::
  ~UniqueNonrepeatingDeferredQueue
            ((UniqueNonrepeatingDeferredQueue<std::pair<wasm::Expression_*,_wasm::Expression_*>_> *)
             local_1a8);
  return bVar4;
}

Assistant:

bool escapes(Expression* allocation) {
    // A queue of flows from children to parents. When something is in the queue
    // here then it assumed that it is ok for the allocation to be at the child
    // (that is, we have already checked the child before placing it in the
    // queue), and we need to check if it is ok to be at the parent, and to flow
    // from the child to the parent. We will analyze that (see
    // ParentChildInteraction, above) and continue accordingly.
    using ChildAndParent = std::pair<Expression*, Expression*>;
    UniqueNonrepeatingDeferredQueue<ChildAndParent> flows;

    // Start the flow from the allocation itself to its parent.
    flows.push({allocation, parents.getParent(allocation)});

    // Keep flowing while we can.
    while (!flows.empty()) {
      auto flow = flows.pop();
      auto* child = flow.first;
      auto* parent = flow.second;

      auto interaction = getParentChildInteraction(allocation, parent, child);
      if (interaction == ParentChildInteraction::Escapes ||
          interaction == ParentChildInteraction::Mixes) {
        // If the parent may let us escape, or the parent mixes other values
        // up with us, give up.
        return true;
      }

      // The parent either fully consumes us, or flows us onwards; either way,
      // we can proceed here, hopefully.
      assert(interaction == ParentChildInteraction::FullyConsumes ||
             interaction == ParentChildInteraction::Flows);

      // We can proceed, as the parent interacts with us properly, and we are
      // the only allocation to get here.

      if (interaction == ParentChildInteraction::Flows) {
        // The value flows through the parent; we need to look further at the
        // grandparent.
        flows.push({parent, parents.getParent(parent)});
      }

      if (auto* set = parent->dynCast<LocalSet>()) {
        // This is one of the sets we are written to, and so we must check for
        // exclusive use of our allocation by all the gets that read the value.
        // Note the set, and we will check the gets at the end once we know all
        // of our sets.
        sets.insert(set);

        // We must also look at how the value flows from those gets.
        for (auto* get : localGraph.getSetInfluences(set)) {
          flows.push({get, parents.getParent(get)});
        }
      }

      // If the parent may send us on a branch, we will need to look at the flow
      // to the branch target(s).
      for (auto name : branchesSentByParent(child, parent)) {
        flows.push({child, branchTargets.getTarget(name)});
      }

      // If we got to here, then we can continue to hope that we can optimize
      // this allocation. Mark the parent and child as reached by it, and
      // continue. The child flows the value to the parent, and the parent's
      // behavior was computed before.
      reachedInteractions[child] = ParentChildInteraction::Flows;
      reachedInteractions[parent] = interaction;
    }

    // We finished the loop over the flows. Do the final checks.
    if (!getsAreExclusiveToSets()) {
      return true;
    }

    // Nothing escapes, hurray!
    return false;
  }